

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetMessageCallback_Ex
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX messageCallback,void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX messageCallback_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetMessageCallback_Ex",0x7d9,1,
                "Invalid argument - iotHubClientHandle is NULL");
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else if (messageCallback == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0) {
    if ((iotHubClientHandle->messageCallback).type == CALLBACK_TYPE_NONE) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SetMessageCallback_Ex",0x7e3,1,
                  "not currently set to accept or process incoming messages.");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else if ((iotHubClientHandle->messageCallback).type == CALLBACK_TYPE_MESSAGE_SYNC) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SetMessageCallback_Ex",0x7e8,1,
                  "Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback function."
                 );
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
    else {
      (*iotHubClientHandle->IoTHubTransport_Unsubscribe)(iotHubClientHandle->deviceHandle);
      (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_NONE;
      (iotHubClientHandle->messageCallback).callbackSync = (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0
      ;
      (iotHubClientHandle->messageCallback).callbackAsync =
           (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0;
      (iotHubClientHandle->messageCallback).userContextCallback = (void *)0x0;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
  }
  else if ((iotHubClientHandle->messageCallback).type == CALLBACK_TYPE_MESSAGE_SYNC) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetMessageCallback_Ex",0x7f9,1,
                "Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_MessageCallbackEx function before subscribing with MessageCallback."
               );
    }
    l._4_4_ = IOTHUB_CLIENT_ERROR;
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe)(iotHubClientHandle->deviceHandle);
    if (iVar1 == 0) {
      (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_MESSAGE_ASYNC;
      (iotHubClientHandle->messageCallback).callbackAsync = messageCallback;
      (iotHubClientHandle->messageCallback).userContextCallback = userContextCallback;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SetMessageCallback_Ex",0x807,1,
                  "IoTHubTransport_Subscribe failed");
      }
      (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_NONE;
      (iotHubClientHandle->messageCallback).callbackSync = (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0
      ;
      (iotHubClientHandle->messageCallback).callbackAsync =
           (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0;
      (iotHubClientHandle->messageCallback).userContextCallback = (void *)0x0;
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetMessageCallback_Ex(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX messageCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL)
    {
        LogError("Invalid argument - iotHubClientHandle is NULL");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (messageCallback == NULL)
        {
            if (handleData->messageCallback.type == CALLBACK_TYPE_NONE)
            {
                LogError("not currently set to accept or process incoming messages.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (handleData->messageCallback.type == CALLBACK_TYPE_MESSAGE_SYNC)
            {
                LogError("Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback function.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                handleData->IoTHubTransport_Unsubscribe(handleData->deviceHandle);
                handleData->messageCallback.type = CALLBACK_TYPE_NONE;
                handleData->messageCallback.callbackSync = NULL;
                handleData->messageCallback.callbackAsync = NULL;
                handleData->messageCallback.userContextCallback = NULL;
                result = IOTHUB_CLIENT_OK;
            }
        }
        else
        {
            if (handleData->messageCallback.type == CALLBACK_TYPE_MESSAGE_SYNC)
            {
                LogError("Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_MessageCallbackEx function before subscribing with MessageCallback.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                if (handleData->IoTHubTransport_Subscribe(handleData->deviceHandle) == 0)
                {
                    handleData->messageCallback.type = CALLBACK_TYPE_MESSAGE_ASYNC;
                    handleData->messageCallback.callbackAsync = messageCallback;
                    handleData->messageCallback.userContextCallback = userContextCallback;
                    result = IOTHUB_CLIENT_OK;
                }
                else
                {
                    LogError("IoTHubTransport_Subscribe failed");
                    handleData->messageCallback.type = CALLBACK_TYPE_NONE;
                    handleData->messageCallback.callbackSync = NULL;
                    handleData->messageCallback.callbackAsync = NULL;
                    handleData->messageCallback.userContextCallback = NULL;
                    result = IOTHUB_CLIENT_ERROR;
                }
            }
        }
    }
    return result;
}